

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O1

void GPU_MultMatrix(float *A)

{
  float *A_00;
  float temp [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  A_00 = GPU_GetCurrentMatrix();
  if (A_00 != (float *)0x0) {
    GPU_FlushBlitBuffer();
    GPU_MatrixMultiply((float *)&local_58,A_00,A);
    *(undefined8 *)(A_00 + 0xc) = local_28;
    *(undefined8 *)(A_00 + 0xe) = uStack_20;
    *(undefined8 *)(A_00 + 8) = local_38;
    *(undefined8 *)(A_00 + 10) = uStack_30;
    *(undefined8 *)(A_00 + 4) = local_48;
    *(undefined8 *)(A_00 + 6) = uStack_40;
    *(undefined8 *)A_00 = local_58;
    *(undefined8 *)(A_00 + 2) = uStack_50;
  }
  return;
}

Assistant:

void GPU_MultMatrix(const float* A)
{
    float* result = GPU_GetCurrentMatrix();
    if(result == NULL)
        return;
	GPU_FlushBlitBuffer();
	// BIG FIXME: All of these matrix stack manipulators should be flushing the blit buffer.
	// A better solution would be to minimize the matrix stack API and make it clear that MultMatrix flushes.
    GPU_MultiplyAndAssign(result, A);
}